

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O2

ostream * operator<<(ostream *ostream,Order *order)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(ostream,"ID: ");
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::operator<<(poVar1,(string *)order);
  poVar1 = std::operator<<(poVar1," OWNER: ");
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::operator<<(poVar1,(string *)&order->m_owner);
  poVar1 = std::operator<<(poVar1," PRICE: ");
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(order->m_price);
  poVar1 = std::operator<<(poVar1," QUANTITY: ");
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<( std::ostream& ostream, const Order& order )
{
  return ostream
         << "ID: " << std::setw( 10 ) << "," << order.getClientID()
         << " OWNER: " << std::setw( 10 ) << "," << order.getOwner()
         << " PRICE: " << std::setw( 10 ) << "," << order.getPrice()
         << " QUANTITY: " << std::setw( 10 ) << "," << order.getQuantity();
}